

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net_sockets.c
# Opt level: O0

int net_would_block(mbedtls_net_context *ctx)

{
  int iVar1;
  uint uVar2;
  int *piVar3;
  int err;
  mbedtls_net_context *ctx_local;
  
  piVar3 = __errno_location();
  iVar1 = *piVar3;
  uVar2 = fcntl(ctx->fd,3);
  if ((uVar2 & 0x800) == 0x800) {
    piVar3 = __errno_location();
    *piVar3 = iVar1;
    if (iVar1 == 0xb) {
      ctx_local._4_4_ = 1;
    }
    else {
      ctx_local._4_4_ = 0;
    }
  }
  else {
    piVar3 = __errno_location();
    *piVar3 = iVar1;
    ctx_local._4_4_ = 0;
  }
  return ctx_local._4_4_;
}

Assistant:

static int net_would_block(const mbedtls_net_context *ctx)
{
    int err = errno;

    /*
     * Never return 'WOULD BLOCK' on a blocking socket
     */
    if ((fcntl(ctx->fd, F_GETFL) & O_NONBLOCK) != O_NONBLOCK) {
        errno = err;
        return 0;
    }

    switch (errno = err) {
#if defined EAGAIN
        case EAGAIN:
#endif
#if defined EWOULDBLOCK && EWOULDBLOCK != EAGAIN
        case EWOULDBLOCK:
#endif
    return 1;
    }
    return 0;
}